

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrame.h
# Opt level: O2

void __thiscall
chrono::ChFrame<double>::ChFrame(ChFrame<double> *this,ChVector<double> *mv,ChMatrix33<double> *ma)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ChQuaternion<double> CStack_48;
  
  this->_vptr_ChFrame = (_func_int **)&PTR__ChFrame_0114f1e0;
  ChMatrix33<double>::Get_A_quaternion(&CStack_48,ma);
  ChCoordsys<double>::ChCoordsys(&this->coord,mv,&CStack_48);
  (this->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       (ma->super_Matrix<double,_3,_3,_1,_3,_3>).
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  dVar1 = (ma->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  dVar2 = (ma->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  dVar3 = (ma->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  dVar4 = (ma->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  dVar5 = (ma->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  dVar6 = (ma->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  dVar7 = (ma->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  (this->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (ma->super_Matrix<double,_3,_3,_1,_3,_3>).
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  (this->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = dVar1;
  (this->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = dVar2;
  (this->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = dVar3;
  (this->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = dVar4;
  (this->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] = dVar5;
  (this->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] = dVar6;
  (this->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] = dVar7;
  return;
}

Assistant:

ChFrame(const ChVector<Real>& mv, const ChMatrix33<Real>& ma) : coord(mv, ma.Get_A_quaternion()), Amatrix(ma) {}